

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O2

SuperVars * __thiscall
jsonnet::internal::Desugarer::desugarFields
          (SuperVars *__return_storage_ptr__,Desugarer *this,AST *ast,ObjectFields *fields,
          uint obj_level)

{
  Kind KVar1;
  AST *pAVar2;
  value_type *__x;
  int iVar3;
  LiteralString *pLVar4;
  Conditional *pCVar5;
  Function *pFVar6;
  Local *pLVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar8;
  AST **ppAVar9;
  AST **extraout_RDX;
  AST **extraout_RDX_00;
  AST **extraout_RDX_01;
  AST **extraout_RDX_02;
  void *__child_stack;
  ArgParams *pAVar10;
  pointer pOVar11;
  uint obj_level_00;
  undefined4 in_register_00000084;
  undefined1 *puVar12;
  LocationRange *args;
  AST **args_5;
  ObjectField *field;
  pointer pOVar13;
  undefined1 *puVar14;
  void *__child_stack_00;
  BinaryOp local_148;
  uint counter;
  AST *index;
  Binds binds;
  ObjectFields copy;
  AST *local_108;
  void *local_100;
  AST *local_f8;
  SuperIndex *local_f0;
  Binary *local_e8;
  undefined1 local_e0 [32];
  pointer local_c0;
  pointer local_b8;
  
  puVar12 = (undefined1 *)CONCAT44(in_register_00000084,obj_level);
  pOVar11 = (fields->
            super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  obj_level_00 = obj_level + 1;
  for (ppAVar9 = &((fields->
                   super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                   )._M_impl.super__Vector_impl_data._M_start)->expr3;
      (pointer)(ppAVar9 + -0x20) != pOVar11; ppAVar9 = ppAVar9 + 0x24) {
    if (ppAVar9[-0x12] != (AST *)0x0) {
      desugar(this,ppAVar9 + -0x12,obj_level);
    }
    desugar(this,ppAVar9 + -1,obj_level_00);
    if (*ppAVar9 != (AST *)0x0) {
      desugar(this,ppAVar9,obj_level_00);
    }
    desugarParams(this,(ArgParams *)(ppAVar9 + -8),obj_level_00);
  }
  pOVar11 = (fields->
            super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppAVar9 = &((fields->
                   super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                   )._M_impl.super__Vector_impl_data._M_start)->expr2;
      (pointer)(ppAVar9 + -0x1f) != pOVar11; ppAVar9 = ppAVar9 + 0x24) {
    if (((pointer)(ppAVar9 + -0x1f))->kind == ASSERT) {
      pLVar4 = (LiteralString *)ppAVar9[1];
      ppAVar9[1] = (AST *)0x0;
      if (pLVar4 == (LiteralString *)0x0) {
        pAVar2 = *ppAVar9;
        ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                  ((u32string *)local_e0,L"Object assertion failed.",(allocator<char32_t> *)&copy);
        pLVar4 = str(this,&pAVar2->location,(UString *)local_e0);
        ::std::__cxx11::u32string::~u32string((u32string *)local_e0);
      }
      pAVar2 = *ppAVar9;
      binds.
      super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(binds.
                             super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
      local_e0._0_8_ =
           make<jsonnet::internal::LiteralBoolean,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                     (this,(LocationRange *)E,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(bool *)&binds);
      copy.
      super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)error(this,&pLVar4->super_AST);
      puVar12 = EF;
      pCVar5 = make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::LiteralBoolean*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Error*>
                         (this,&pAVar2->location,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,ppAVar9,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(LiteralBoolean **)local_e0,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(Error **)&copy);
      *ppAVar9 = &pCVar5->super_AST;
    }
  }
  pOVar13 = (fields->
            super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (pOVar11 = (fields->
                 super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                 )._M_impl.super__Vector_impl_data._M_start; pOVar11 != pOVar13;
      pOVar11 = pOVar11 + 1) {
    if (pOVar11->methodSugar == true) {
      pAVar10 = &pOVar11->params;
      puVar12 = (undefined1 *)pAVar10;
      pFVar6 = make<jsonnet::internal::Function,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
                         (this,&pOVar11->expr2->location,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&pOVar11->fodderL,pAVar10,&pOVar11->trailingComma,&pOVar11->fodderR,
                          &pOVar11->expr2);
      pOVar11->expr2 = &pFVar6->super_AST;
      pOVar11->methodSugar = false;
      ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      clear(pAVar10);
    }
  }
  ::std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
  vector(&copy,fields);
  ::std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
  clear(fields);
  pOVar11 = copy.
            super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  binds.
  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  binds.
  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  binds.
  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppAVar9 = extraout_RDX;
  for (pOVar13 = copy.
                 super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                 ._M_impl.super__Vector_impl_data._M_start; pOVar13 != pOVar11;
      pOVar13 = pOVar13 + 1) {
    if (pOVar13->kind == LOCAL) {
      bind((Desugarer *)local_e0,(int)this,(sockaddr *)pOVar13->id,(socklen_t)pOVar13->expr2);
      ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
      ::emplace_back<jsonnet::internal::Local::Bind>(&binds,(Bind *)local_e0);
      Local::Bind::~Bind((Bind *)local_e0);
      ppAVar9 = extraout_RDX_00;
    }
  }
  for (pAVar10 = (ArgParams *)
                 &(copy.
                   super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                   ._M_impl.super__Vector_impl_data._M_start)->expr2;
      __x = (value_type *)((long)(pAVar10 + -0xb) + 0x10),
      __x != copy.
             super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
             ._M_impl.super__Vector_impl_data._M_finish; pAVar10 = pAVar10 + 0xc) {
    if (__x->kind != LOCAL) {
      if (binds.
          super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          binds.
          super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        puVar12 = (undefined1 *)pAVar10;
        pLVar7 = make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>&,jsonnet::internal::AST*&>
                           (this,(LocationRange *)
                                 ((long)&(((pAVar10->
                                           super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->idFodder).
                                         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                         ._M_impl + 8),
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,&binds,(AST **)pAVar10);
        (pAVar10->
        super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)pLVar7;
      }
      ::std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
      ::push_back(fields,__x);
      ppAVar9 = extraout_RDX_01;
    }
  }
  pOVar11 = (fields->
            super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pOVar13 = (fields->
            super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pOVar11 == pOVar13) {
      (__return_storage_ptr__->
      super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      counter = 0;
      (__return_storage_ptr__->
      super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pOVar11 = (fields->
                super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      args = &ast->location;
      puVar14 = (undefined1 *)__return_storage_ptr__;
      for (args_5 = &((fields->
                      super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                      )._M_impl.super__Vector_impl_data._M_start)->expr2;
          (pointer)(args_5 + -0x1f) != pOVar11; args_5 = args_5 + 0x24) {
        if (*(bool *)((long)args_5 + -0x8c) == true) {
          iVar3 = clone(this,(__fn *)args_5[-0x11],ppAVar9,(int)puVar14,puVar12);
          index = (AST *)CONCAT44(extraout_var,iVar3);
          local_e0._8_8_ = this->alloc;
          local_e0._0_8_ = &PTR_fodderElement_0022ca88;
          local_c0 = (pointer)&counter;
          local_b8 = (pointer)0x0;
          ppAVar9 = &index;
          local_e0._16_8_ = this;
          local_e0._24_8_ = __return_storage_ptr__;
          CompilerPass::expr((CompilerPass *)local_e0,ppAVar9);
          puVar12 = EF;
          local_e0._0_8_ =
               make<jsonnet::internal::InSuper,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                         (this,args,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,ppAVar9,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF);
          __child_stack_00 = (void *)0x1a0c5e;
          iVar3 = clone(this,(__fn *)index,__child_stack,(int)ppAVar9,puVar12);
          local_f8 = (AST *)CONCAT44(extraout_var_00,iVar3);
          local_100 = (void *)0x0;
          local_f0 = make<jsonnet::internal::SuperIndex,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr)>
                               (this,args,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                       *)EF,&local_f8,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF,&local_100);
          local_148 = BOP_PLUS;
          puVar12 = EF;
          ppAVar9 = args_5;
          local_e8 = make<jsonnet::internal::Binary,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::SuperIndex*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::AST*&>
                               (this,args,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF,&local_f0,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF,&local_148,args_5);
          iVar3 = clone(this,(__fn *)*args_5,__child_stack_00,(int)ppAVar9,puVar12);
          local_108 = (AST *)CONCAT44(extraout_var_01,iVar3);
          ppAVar9 = &local_108;
          puVar14 = EF;
          puVar12 = EF;
          pCVar5 = make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::InSuper*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Binary*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*>
                             (this,args,
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)EF,(InSuper **)local_e0,
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)EF,&local_e8,
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)EF,ppAVar9);
          *args_5 = &pCVar5->super_AST;
          *(bool *)((long)args_5 + -0x8c) = false;
        }
      }
      ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
      ::~vector(&binds);
      ::std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
      ::~vector(&copy);
      return __return_storage_ptr__;
    }
    KVar1 = pOVar11->kind;
    if (KVar1 == FIELD_ID) {
      pLVar4 = str(this,&pOVar11->idLocation,&pOVar11->id->name);
      pOVar11->expr1 = &pLVar4->super_AST;
      ppAVar9 = extraout_RDX_02;
LAB_001a0b4c:
      pOVar11->kind = FIELD_EXPR;
    }
    else {
      if (KVar1 == FIELD_STR) goto LAB_001a0b4c;
      if (KVar1 == LOCAL) {
        poVar8 = ::std::operator<<((ostream *)&::std::cerr,"Locals should be removed by now.");
        ::std::endl<char,std::char_traits<char>>(poVar8);
        abort();
      }
    }
    pOVar11 = pOVar11 + 1;
  } while( true );
}

Assistant:

SuperVars desugarFields(AST *ast, ObjectFields &fields, unsigned obj_level)
    {
        // Desugar children
        for (auto &field : fields) {
            if (field.expr1 != nullptr)
                desugar(field.expr1, obj_level);
            desugar(field.expr2, obj_level + 1);
            if (field.expr3 != nullptr)
                desugar(field.expr3, obj_level + 1);
            desugarParams(field.params, obj_level + 1);
        }

        // Simplify asserts
        for (auto &field : fields) {
            if (field.kind != ObjectField::ASSERT)
                continue;
            AST *msg = field.expr3;
            field.expr3 = nullptr;
            if (msg == nullptr) {
                // The location is what appears in the stacktrace.
                msg = str(field.expr2->location, U"Object assertion failed.");
            }

            // if expr2 then true else error msg
            field.expr2 = make<Conditional>(field.expr2->location,
                                            EF,
                                            field.expr2,
                                            EF,
                                            make<LiteralBoolean>(E, EF, true),
                                            EF,
                                            error(msg));
        }

        // Remove methods
        for (auto &field : fields) {
            if (!field.methodSugar)
                continue;
            field.expr2 = make<Function>(field.expr2->location,
                                         EF,
                                         field.fodderL,
                                         field.params,
                                         field.trailingComma,
                                         field.fodderR,
                                         field.expr2);
            field.methodSugar = false;
            field.params.clear();
        }

        // Remove object-level locals
        auto copy = fields;
        fields.clear();
        Local::Binds binds;
        for (auto &local : copy) {
            if (local.kind != ObjectField::LOCAL)
                continue;
            binds.push_back(bind(local.id, local.expr2));
        }
        for (auto &field : copy) {
            if (field.kind == ObjectField::LOCAL)
                continue;
            if (!binds.empty())
                field.expr2 = make<Local>(field.expr2->location, EF, binds, field.expr2);
            fields.push_back(field);
        }

        // Change all to FIELD_EXPR
        for (auto &field : fields) {
            switch (field.kind) {
                case ObjectField::ASSERT:
                    // Nothing to do.
                    break;

                case ObjectField::FIELD_ID:
                    field.expr1 = str(field.idLocation, field.id->name);
                    field.kind = ObjectField::FIELD_EXPR;
                    break;

                case ObjectField::FIELD_EXPR:
                    // Nothing to do.
                    break;

                case ObjectField::FIELD_STR:
                    // Just set the flag.
                    field.kind = ObjectField::FIELD_EXPR;
                    break;

                case ObjectField::LOCAL:
                    std::cerr << "Locals should be removed by now." << std::endl;
                    abort();
            }
        }

        /** Replaces all occurrences of self, super[f] and e in super with variables.
         *
         * Returns all variables and original expressions via super_vars.
         */
        class SubstituteSelfSuper : public CompilerPass {
            Desugarer *desugarer;
            SuperVars &superVars;
            unsigned &counter;
            const Identifier *newSelf;

           public:
            SubstituteSelfSuper(Desugarer *desugarer, SuperVars &super_vars, unsigned &counter)
                : CompilerPass(*desugarer->alloc),
                  desugarer(desugarer),
                  superVars(super_vars),
                  counter(counter),
                  newSelf(nullptr)
            {
            }
            void visitExpr(AST *&expr)
            {
                if (dynamic_cast<Self *>(expr)) {
                    if (newSelf == nullptr) {
                        newSelf = desugarer->id(U"$outer_self");
                        superVars.emplace_back(newSelf, nullptr);
                    }
                    expr = alloc.make<Var>(expr->location, expr->openFodder, newSelf);
                } else if (auto *super_index = dynamic_cast<SuperIndex *>(expr)) {
                    UStringStream ss;
                    ss << U"$outer_super_index" << (counter++);
                    const Identifier *super_var = desugarer->id(ss.str());
                    // Desugaring of expr should already have occurred.
                    assert(super_index->index != nullptr);
                    // Re-use super_index since we're replacing it here.
                    superVars.emplace_back(super_var, super_index);
                    expr = alloc.make<Var>(expr->location, expr->openFodder, super_var);
                } else if (auto *in_super = dynamic_cast<InSuper *>(expr)) {
                    UStringStream ss;
                    ss << U"$outer_in_super" << (counter++);
                    const Identifier *in_super_var = desugarer->id(ss.str());
                    // Re-use in_super since we're replacing it here.
                    superVars.emplace_back(in_super_var, in_super);
                    expr = alloc.make<Var>(expr->location, expr->openFodder, in_super_var);
                }
                CompilerPass::visitExpr(expr);
            }
        };

        SuperVars super_vars;
        unsigned counter = 0;

        // Remove +:
        for (auto &field : fields) {
            if (!field.superSugar)
                continue;
            // We have to bind self/super from expr1 outside the class, as we copy the expression
            // into the field body.
            // Clone it so that we maintain the AST as a tree.
            AST *index = clone(field.expr1);
            // This will remove self/super.
            SubstituteSelfSuper(this, super_vars, counter).expr(index);
            field.expr2 = make<Conditional>(
                ast->location,
                EF,
                make<InSuper>(ast->location, EF, index, EF, EF),
                EF,
                make<Binary>(ast->location,
                             EF,
                             make<SuperIndex>(ast->location, EF, EF, clone(index), EF, nullptr),
                             EF,
                             BOP_PLUS,
                             field.expr2),
                EF,
                clone(field.expr2));
            field.superSugar = false;
        }

        return super_vars;
    }